

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O2

void property_init(void)

{
  char *pcVar1;
  char *pcVar2;
  char *__ptr;
  char *pcVar3;
  char *value;
  ushort **ppuVar4;
  ushort *puVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  uint local_34;
  
  for (lVar7 = 8; lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
    property_set(*(char **)((long)&mount_flags[8].flag + lVar7),
                 *(char **)((long)&set_default_properties_propList + lVar7));
  }
  __ptr = (char *)read_file("/platform//property/default.prop",&local_34);
  pcVar1 = __ptr;
  if (__ptr != (char *)0x0) {
    while (pcVar8 = pcVar1, pcVar3 = strchr(pcVar8,10), pcVar3 != (char *)0x0) {
      pcVar1 = pcVar3 + 1;
      *pcVar3 = '\0';
      value = strchr(pcVar8,0x3d);
      if (value != (char *)0x0) {
        *value = '\0';
        ppuVar4 = __ctype_b_loc();
        puVar5 = *ppuVar4;
        pcVar8 = pcVar8 + -1;
        do {
          pcVar2 = pcVar8 + 1;
          pcVar8 = pcVar8 + 1;
        } while ((*(byte *)((long)puVar5 + (long)*pcVar2 * 2 + 1) & 0x20) != 0);
        pcVar6 = value;
        if (*pcVar2 != '#') {
          while ((pcVar6 = pcVar6 + -1, pcVar8 < pcVar6 &&
                 ((*(byte *)((long)puVar5 + (long)*pcVar6 * 2 + 1) & 0x20) != 0))) {
            *pcVar6 = '\0';
            puVar5 = *ppuVar4;
          }
          do {
            pcVar2 = value + 1;
            value = value + 1;
          } while ((*(byte *)((long)puVar5 + (long)*pcVar2 * 2 + 1) & 0x20) != 0);
          while ((pcVar3 = pcVar3 + -1, value < pcVar3 &&
                 ((*(byte *)((long)*ppuVar4 + (long)*pcVar3 * 2 + 1) & 0x20) != 0))) {
            *pcVar3 = '\0';
          }
          property_set(pcVar8,value);
        }
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

void property_init(void)
{
    set_default_properties();
	load_properties_from_file(PROP_PATH_SYSTEM_DEFAULT);
}